

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schriter.cpp
# Opt level: O2

void __thiscall
icu_63::StringCharacterIterator::StringCharacterIterator
          (StringCharacterIterator *this,UnicodeString *textStr,int32_t textBegin,int32_t textEnd,
          int32_t textPos)

{
  short sVar1;
  char16_t *pcVar2;
  int32_t length;
  ConstChar16Ptr local_40;
  char16_t *local_38;
  
  local_40.p_ = UnicodeString::getBuffer(textStr);
  sVar1 = (textStr->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    length = (textStr->fUnion).fFields.fLength;
  }
  else {
    length = (int)sVar1 >> 5;
  }
  UCharCharacterIterator::UCharCharacterIterator
            (&this->super_UCharCharacterIterator,&local_40,length,textBegin,textEnd,textPos);
  local_38 = local_40.p_;
  (this->super_UCharCharacterIterator).super_CharacterIterator.super_ForwardCharacterIterator.
  super_UObject._vptr_UObject = (_func_int **)&PTR__StringCharacterIterator_003e3aa0;
  UnicodeString::UnicodeString(&this->text,textStr);
  pcVar2 = UnicodeString::getBuffer(&this->text);
  (this->super_UCharCharacterIterator).text = pcVar2;
  return;
}

Assistant:

StringCharacterIterator::StringCharacterIterator(const UnicodeString& textStr,
                                                 int32_t textBegin,
                                                 int32_t textEnd,
                                                 int32_t textPos)
  : UCharCharacterIterator(textStr.getBuffer(), textStr.length(), textBegin, textEnd, textPos),
    text(textStr)
{
    // we had set the input parameter's array, now we need to set our copy's array
    UCharCharacterIterator::text = this->text.getBuffer();
}